

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadInputChannel
          (ColladaParser *this,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *poChannels)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *pbVar4;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_260;
  uint local_240;
  uint local_23c;
  int attrSet;
  int attrOffset;
  string local_c0;
  char *local_a0;
  char *source;
  int attrSource;
  string semantic;
  undefined1 local_58 [4];
  int attrSemantic;
  InputChannel channel;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
  *poChannels_local;
  ColladaParser *this_local;
  
  channel.mResolved = (Accessor *)poChannels;
  Collada::InputChannel::InputChannel((InputChannel *)local_58);
  uVar1 = GetAttribute(this,"semantic");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&attrSource,(char *)CONCAT44(extraout_var,iVar2),
             (allocator *)((long)&source + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&source + 7));
  local_58 = (undefined1  [4])GetTypeForSemantic(this,(string *)&attrSource);
  source._0_4_ = GetAttribute(this,"source");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)source);
  local_a0 = (char *)CONCAT44(extraout_var_00,iVar2);
  if (*local_a0 != '#') {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&attrSet);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &attrSet,(char (*) [34])"Unknown reference format in url \"");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,&local_a0);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [42])"\" in source attribute of <input> element.");
    Formatter::basic_formatter::operator_cast_to_string(&local_c0,pbVar4);
    ThrowException(this,&local_c0);
  }
  std::__cxx11::string::operator=((string *)&channel.mOffset,local_a0 + 1);
  local_23c = TestAttribute(this,"offset");
  if (-1 < (int)local_23c) {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)local_23c);
    channel.mIndex = (size_t)iVar2;
  }
  if (((local_58 == (undefined1  [4])0x4) || (local_58 == (undefined1  [4])0x5)) &&
     (local_240 = TestAttribute(this,"set"), -1 < (int)local_240)) {
    local_240 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)local_240);
    if ((int)local_240 < 0) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter(&local_3d8);
      pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_3d8,(char (*) [16])"Invalid index \"");
      pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar3,(int *)&local_240);
      pbVar4 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar3,(char (*) [38])"\" in set attribute of <input> element");
      Formatter::basic_formatter::operator_cast_to_string(&local_260,pbVar4);
      ThrowException(this,&local_260);
    }
    channel._0_8_ = SEXT48((int)local_240);
  }
  if (local_58 != (undefined1  [4])0x0) {
    std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
    push_back((vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
               *)channel.mResolved,(value_type *)local_58);
  }
  SkipElement(this);
  std::__cxx11::string::~string((string *)&attrSource);
  Collada::InputChannel::~InputChannel((InputChannel *)local_58);
  return;
}

Assistant:

void ColladaParser::ReadInputChannel(std::vector<InputChannel>& poChannels)
{
    InputChannel channel;

    // read semantic
    int attrSemantic = GetAttribute("semantic");
    std::string semantic = mReader->getAttributeValue(attrSemantic);
    channel.mType = GetTypeForSemantic(semantic);

    // read source
    int attrSource = GetAttribute("source");
    const char* source = mReader->getAttributeValue(attrSource);
    if (source[0] != '#')
        ThrowException(format() << "Unknown reference format in url \"" << source << "\" in source attribute of <input> element.");
    channel.mAccessor = source + 1; // skipping the leading #, hopefully the remaining text is the accessor ID only

    // read index offset, if per-index <input>
    int attrOffset = TestAttribute("offset");
    if (attrOffset > -1)
        channel.mOffset = mReader->getAttributeValueAsInt(attrOffset);

    // read set if texture coordinates
    if (channel.mType == IT_Texcoord || channel.mType == IT_Color) {
        int attrSet = TestAttribute("set");
        if (attrSet > -1) {
            attrSet = mReader->getAttributeValueAsInt(attrSet);
            if (attrSet < 0)
                ThrowException(format() << "Invalid index \"" << (attrSet) << "\" in set attribute of <input> element");

            channel.mIndex = attrSet;
        }
    }

    // store, if valid type
    if (channel.mType != IT_Invalid)
        poChannels.push_back(channel);

    // skip remaining stuff of this element, if any
    SkipElement();
}